

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_element.cpp
# Opt level: O0

string * __thiscall ICM::to_string_abi_cxx11_(string *__return_storage_ptr__,ICM *this,AST *ast)

{
  bool bVar1;
  type this_00;
  Node *node;
  RangeIterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
  RVar2;
  string local_80;
  unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *local_60;
  unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *e;
  __normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>
  __end2;
  __normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>
  __begin2;
  RangeIterator<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
  *__range2;
  allocator local_1a;
  undefined1 local_19;
  AST *local_18;
  AST *ast_local;
  string *str;
  
  local_19 = 0;
  local_18 = (AST *)this;
  ast_local = (AST *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{AST:",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  bVar1 = AST::empty(local_18);
  if (bVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    RVar2 = AST::getTableRange(local_18);
    __begin2 = RVar2.
               super_RangeBase<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
               ._begin._M_current;
    __end2 = Common::
             RangeBase<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
             ::begin((RangeBase<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
                      *)&__begin2);
    e = (unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *)
        Common::
        RangeBase<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
        ::end((RangeBase<__gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>,___gnu_cxx::__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>_>
               *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>
                                       *)&e), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>
                 ::operator*(&__end2);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      this_00 = std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>::
                operator*(local_60);
      to_string_abi_cxx11_(&local_80,(ICM *)this_00,node);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_*,_std::vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(const AST &ast) {
		string str("{AST:");
		if (ast.empty())
			str.append("NIL");
		else {
			for (const auto &e : ast.getTableRange()) {
				str.append("\n ");
				str.append(ICM::to_string(*e));
			}
		}
		str.append("\n}");
		return str;
	}